

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O2

Matrix33d * gmath::createR(Matrix33d *__return_storage_ptr__,Vector3d *n,double phi)

{
  double dVar1;
  undefined1 auVar2 [16];
  Matrix33d m2;
  Matrix33d m3;
  Matrix33d m1;
  SMatrix<double,_3,_3> local_268;
  SMatrix<double,_3,_3> local_220;
  SMatrix<double,_3,_3> local_1d8;
  SMatrix<double,_3,_3> local_190;
  SMatrix<double,_3,_3> local_148;
  SMatrix<double,_3,_3> local_100;
  SMatrix<double,_3,_3> local_b8;
  SMatrix<double,_3,_3> local_70;
  
  SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  dVar1 = norm<double,3>(n);
  if (0.0 < dVar1) {
    SMatrix<double,_3,_3>::SMatrix(&local_70);
    SMatrix<double,_3,_3>::SMatrix(&local_268);
    SMatrix<double,_3,_3>::SMatrix(&local_b8);
    local_b8.v[1][0] = n->v[2] / dVar1;
    auVar2._8_8_ = dVar1;
    auVar2._0_8_ = dVar1;
    auVar2 = divpd(*(undefined1 (*) [16])n->v,auVar2);
    local_b8.v[0][0] = 0.0;
    local_b8.v[0][1] = -local_b8.v[1][0];
    local_b8.v[2][1] = auVar2._0_8_;
    local_b8.v[0][2] = auVar2._8_8_;
    local_268.v[0][0] = local_b8.v[2][1] * local_b8.v[2][1];
    local_268.v[0][1] = local_b8.v[2][1] * local_b8.v[0][2];
    local_b8.v[1][1] = 0.0;
    local_b8.v[1][2] = -local_b8.v[2][1];
    local_b8.v[2][0] = -local_b8.v[0][2];
    local_268.v[0][2] = local_b8.v[1][0] * local_b8.v[2][1];
    local_268.v[1][2] = local_b8.v[1][0] * local_b8.v[0][2];
    local_268.v[1][1] = local_b8.v[0][2] * local_b8.v[0][2];
    local_268.v[2][2] = local_b8.v[1][0] * local_b8.v[1][0];
    local_b8.v[2][2] = 0.0;
    local_268.v[1][0] = local_268.v[0][1];
    local_268.v[2][0] = local_268.v[0][2];
    local_268.v[2][1] = local_268.v[1][2];
    dVar1 = cos(phi);
    operator*(&local_190,dVar1,&local_70);
    dVar1 = cos(phi);
    operator*(&local_1d8,1.0 - dVar1,&local_268);
    SMatrix<double,_3,_3>::operator+(&local_148,&local_190,&local_1d8);
    dVar1 = sin(phi);
    operator*(&local_220,dVar1,&local_b8);
    SMatrix<double,_3,_3>::operator+(&local_100,&local_148,&local_220);
    SMatrix<double,_3,_3>::operator=(__return_storage_ptr__,&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createR(const Vector3d &n, double phi)
{
  Matrix33d R;

  double l=norm(n);

  if (l > 0)
  {
    Matrix33d m1, m2, m3;

    double n1=n[0]/l;
    double n2=n[1]/l;
    double n3=n[2]/l;

    m2(0, 0)=n1*n1; m2(0, 1)=n1*n2; m2(0, 2)=n1*n3;
    m2(1, 0)=n2*n1; m2(1, 1)=n2*n2; m2(1, 2)=n2*n3;
    m2(2, 0)=n3*n1; m2(2, 1)=n3*n2; m2(2, 2)=n3*n3;

    m3(0, 0)=  0; m3(0, 1)=-n3; m3(0, 2)= n2;
    m3(1, 0)= n3; m3(1, 1)=  0; m3(1, 2)=-n1;
    m3(2, 0)=-n2; m3(2, 1)= n1; m3(2, 2)=  0;

    R=cos(phi)*m1 + (1-cos(phi))*m2 + sin(phi)*m3;
  }

  return R;
}